

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileMemory.cpp
# Opt level: O1

void MemoryProfiler::Reset(LPCWSTR name,ArenaMemoryData *memoryData)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined8 *in_FS_OFFSET;
  LPCWSTR local_28;
  ArenaMemoryDataSummary *local_20;
  ArenaMemoryDataSummary *arenaMemoryDataSummary;
  
  local_28 = name;
  bVar3 = JsUtil::
          BaseDictionary<char16_t*,ArenaMemoryDataSummary*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetValue<char16_t*>
                    ((BaseDictionary<char16_t*,ArenaMemoryDataSummary*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)&memoryData->profiler->arenaDataMap,&local_28,&local_20);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ProfileMemory.cpp"
                       ,0x86,"(hasItem)","hasItem");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  AccumulateData(local_20,memoryData,true);
  memoryData->freelistBytes = 0;
  memoryData->freelistCount = 0;
  memoryData->reuseBytes = 0;
  memoryData->reuseCount = 0;
  memoryData->requestBytes = 0;
  memoryData->requestCount = 0;
  memoryData->allocatedBytes = 0;
  memoryData->alignmentBytes = 0;
  memoryData->resetCount = memoryData->resetCount + 1;
  return;
}

Assistant:

void
MemoryProfiler::Reset(LPCWSTR name, ArenaMemoryData * memoryData)
{
    MemoryProfiler * memoryProfiler = memoryData->profiler;
    ArenaMemoryDataSummary * arenaMemoryDataSummary;
    bool hasItem = memoryProfiler->arenaDataMap.TryGetValue((LPWSTR)name, &arenaMemoryDataSummary);
    Assert(hasItem);


    AccumulateData(arenaMemoryDataSummary, memoryData, true);
    memoryData->allocatedBytes = 0;
    memoryData->alignmentBytes = 0;
    memoryData->requestBytes = 0;
    memoryData->requestCount = 0;
    memoryData->reuseBytes = 0;
    memoryData->reuseCount = 0;
    memoryData->freelistBytes = 0;
    memoryData->freelistCount = 0;
    memoryData->resetCount++;
}